

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_file.hpp
# Opt level: O2

void __thiscall iutest::TempFile::~TempFile(TempFile *this)

{
  (this->super_IFile).super_IOutStream._vptr_IOutStream = (_func_int **)&PTR__TempFile_00133490;
  (this->super_IFile).super_IInStream._vptr_IInStream = (_func_int **)&PTR__TempFile_001334e0;
  Close(this);
  std::__cxx11::string::~string((string *)&this->m_filename);
  StdioFile::~StdioFile(&this->m_file);
  return;
}

Assistant:

virtual ~TempFile() { Close(); }